

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  string s;
  string local_78;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Let\'s take LeetCode contest","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_58,local_50 + (long)local_58);
  reverseWords(&local_78);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_38,local_30);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return 0;
}

Assistant:

int main()
{
	string s="Let's take LeetCode contest";
	cout<<reverseWords(s)<<endl;
}